

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_muladd(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,
                      mbedtls_ecp_point *P,mbedtls_mpi *n,mbedtls_ecp_point *Q)

{
  int iVar1;
  mbedtls_ecp_point mP;
  mbedtls_ecp_point local_78;
  
  iVar1 = -0x4e80;
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
    mbedtls_ecp_point_init(&local_78);
    iVar1 = mbedtls_ecp_mul_shortcuts(grp,&local_78,m,P);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_mul_shortcuts(grp,R,n,Q);
      if (iVar1 == 0) {
        iVar1 = ecp_add_mixed(grp,R,&local_78,R);
        if (iVar1 == 0) {
          iVar1 = ecp_normalize_jac(grp,R);
        }
      }
    }
    mbedtls_ecp_point_free(&local_78);
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_muladd( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             const mbedtls_mpi *n, const mbedtls_ecp_point *Q )
{
    int ret;
    mbedtls_ecp_point mP;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

    if( ecp_get_type( grp ) != ECP_TYPE_SHORT_WEIERSTRASS )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    mbedtls_ecp_point_init( &mP );

    MBEDTLS_MPI_CHK( mbedtls_ecp_mul_shortcuts( grp, &mP, m, P ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul_shortcuts( grp, R,   n, Q ) );

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if (  is_grp_capable = mbedtls_internal_ecp_grp_capable( grp )  )
    {
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
    MBEDTLS_MPI_CHK( ecp_add_mixed( grp, R, &mP, R ) );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, R ) );

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ( is_grp_capable )
    {
        mbedtls_internal_ecp_free( grp );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
    mbedtls_ecp_point_free( &mP );

    return( ret );
}